

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O3

bool __thiscall
QTranslator::load(QTranslator *this,QString *filename,QString *directory,QString *search_delimiters,
                 QString *suffix)

{
  QTranslatorPrivate *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  storage_type_conflict *psVar5;
  bool bVar6;
  QtPrivate *pQVar7;
  QtPrivate *pQVar8;
  char16_t *pcVar9;
  CaseSensitivity in_R9D;
  qsizetype qVar10;
  long lVar11;
  long in_FS_OFFSET;
  QStringView haystack;
  QFileInfo fi;
  QArrayData *local_100;
  QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&> local_e0;
  QString local_c8;
  QFileInfo local_b0;
  QString local_a8;
  QStringView local_88;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTranslatorPrivate *)(this->super_QObject).d_ptr.d;
  QTranslatorPrivate::clear(this_00);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QFileInfo::QFileInfo((QFileInfo *)&local_78,filename);
  bVar6 = QFileInfo::isRelative((QFileInfo *)&local_78);
  QFileInfo::~QFileInfo((QFileInfo *)&local_78);
  if (bVar6) {
    QString::operator=(&local_58,directory);
    if (local_58.d.size != 0) {
      bVar6 = QString::endsWith(&local_58,(QChar)0x2f,CaseSensitive);
      if (!bVar6) {
        QString::append(&local_58,(QChar)0x2f);
      }
    }
  }
  local_78.d.ptr = (suffix->d).ptr;
  if (local_78.d.ptr == (char16_t *)0x0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L".qm";
    local_78.d.size = 3;
  }
  else {
    local_78.d.d = (suffix->d).d;
    local_78.d.size = (suffix->d).size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_88.m_data = (filename->d).ptr;
  local_88.m_size = (filename->d).size;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  pcVar9 = (search_delimiters->d).ptr;
  if (pcVar9 == (char16_t *)0x0) {
    pcVar9 = L"_.";
    qVar10 = 2;
  }
  else {
    local_100 = &((search_delimiters->d).d)->super_QArrayData;
    qVar10 = (search_delimiters->d).size;
    if (local_100 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_100->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_100->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      goto LAB_002ca282;
    }
  }
  local_100 = (QArrayData *)0x0;
LAB_002ca282:
  do {
    local_b0.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&local_b0);
    local_e0.b = &local_78;
    local_e0.a.a = &local_58;
    local_e0.a.b = &local_88;
    QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&>::convertTo<QString>
              (&local_c8,&local_e0);
    pcVar4 = local_a8.d.ptr;
    pDVar3 = local_a8.d.d;
    qVar2 = local_c8.d.size;
    pDVar1 = local_c8.d.d;
    local_c8.d.d = local_a8.d.d;
    local_a8.d.d = pDVar1;
    local_a8.d.ptr = local_c8.d.ptr;
    local_c8.d.ptr = pcVar4;
    local_c8.d.size = local_a8.d.size;
    local_a8.d.size = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::setFile(&local_b0,&local_a8);
    bVar6 = QFileInfo::isReadable(&local_b0);
    if (bVar6) {
      bVar6 = QFileInfo::isFile(&local_b0);
      if (!bVar6) goto LAB_002ca34c;
LAB_002ca461:
      QFileInfo::~QFileInfo(&local_b0);
      bVar6 = QTranslatorPrivate::do_load(this_00,&local_a8,directory);
      goto LAB_002ca481;
    }
LAB_002ca34c:
    local_e0.a.a = &local_58;
    local_e0.a.b = &local_88;
    QStringBuilder<QString_&,_QStringView_&>::convertTo<QString>(&local_c8,&local_e0.a);
    pcVar4 = local_a8.d.ptr;
    pDVar3 = local_a8.d.d;
    qVar2 = local_c8.d.size;
    pDVar1 = local_c8.d.d;
    local_c8.d.d = local_a8.d.d;
    local_a8.d.d = pDVar1;
    local_a8.d.ptr = local_c8.d.ptr;
    local_c8.d.ptr = pcVar4;
    local_c8.d.size = local_a8.d.size;
    local_a8.d.size = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::setFile(&local_b0,&local_a8);
    bVar6 = QFileInfo::isReadable(&local_b0);
    if (bVar6) {
      bVar6 = QFileInfo::isFile(&local_b0);
      if (bVar6) goto LAB_002ca461;
    }
    psVar5 = local_88.m_data;
    qVar2 = local_88.m_size;
    if (qVar10 == 0) {
LAB_002ca453:
      QFileInfo::~QFileInfo(&local_b0);
      bVar6 = false;
LAB_002ca481:
      if (local_100 != (QArrayData *)0x0) {
        LOCK();
        (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_100,2,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar6;
      }
      __stack_chk_fail();
    }
    lVar11 = 0;
    pQVar7 = (QtPrivate *)0x0;
    do {
      haystack.m_data = (storage_type_conflict *)0xffffffffffffffff;
      haystack.m_size = (qsizetype)psVar5;
      pQVar8 = (QtPrivate *)
               QtPrivate::lastIndexOf
                         ((QtPrivate *)qVar2,haystack,(ulong)*(ushort *)((long)pcVar9 + lVar11),
                          L'\x01',in_R9D);
      if ((long)pQVar8 < (long)pQVar7) {
        pQVar8 = pQVar7;
      }
      lVar11 = lVar11 + 2;
      pQVar7 = pQVar8;
    } while (qVar10 * 2 != lVar11);
    if (pQVar8 == (QtPrivate *)0x0) goto LAB_002ca453;
    local_88.m_size = (qsizetype)pQVar8;
    QFileInfo::~QFileInfo(&local_b0);
  } while( true );
}

Assistant:

bool QTranslator::load(const QString & filename, const QString & directory,
                       const QString & search_delimiters,
                       const QString & suffix)
{
    Q_D(QTranslator);
    d->clear();

    QString prefix;
    if (QFileInfo(filename).isRelative()) {
        prefix = directory;
        if (prefix.size() && !prefix.endsWith(u'/'))
            prefix += u'/';
    }

    const QString suffixOrDotQM = suffix.isNull() ? dotQmLiteral() : suffix;
    QStringView fname(filename);
    QString realname;
    const QString delims = search_delimiters.isNull() ? QStringLiteral("_.") : search_delimiters;

    for (;;) {
        QFileInfo fi;

        realname = prefix + fname + suffixOrDotQM;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        realname = prefix + fname;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        qsizetype rightmost = 0;
        for (auto ch : delims)
            rightmost = std::max(rightmost, fname.lastIndexOf(ch));

        // no truncations? fail
        if (rightmost == 0)
            return false;

        fname.truncate(rightmost);
    }

    // realname is now the fully qualified name of a readable file.
    return d->do_load(realname, directory);
}